

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx512_functor::unary_op_cos>(Mat *a,Option *opt)

{
  __m512 afVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  float *x;
  long *in_RDI;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  __m128 afVar13;
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_cos op;
  Mat *m;
  float *in_stack_fffffffffffffd00;
  unary_op_cos *in_stack_fffffffffffffd08;
  unary_op_cos *in_stack_fffffffffffffd10;
  unary_op_cos *this;
  float local_2b0 [2];
  float afStack_2a8 [2];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  int local_23c;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined4 local_220;
  long local_218;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 local_208;
  undefined4 local_204;
  undefined4 local_200;
  undefined8 local_1f8;
  float *local_1f0;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  unary_op_cos local_1c9 [9];
  long *local_1c0;
  undefined1 local_1b5;
  int local_1b4;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  unary_op_cos *local_190;
  float *local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  float *local_130;
  float *local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  float *local_f0;
  float *local_e8;
  float local_e0 [2];
  float afStack_d8 [2];
  float *local_d0;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  float *local_b0;
  undefined4 local_a4;
  int local_a0;
  int local_9c;
  undefined8 *local_98;
  undefined4 local_8c;
  long local_88;
  unary_op_cos *local_78;
  
  local_1d0 = *(int *)((long)in_RDI + 0x2c);
  local_1d4 = (int)in_RDI[6];
  local_1d8 = *(int *)((long)in_RDI + 0x34);
  local_1dc = (int)in_RDI[7];
  local_1e0 = (int)in_RDI[3];
  local_1e4 = local_1d0 * local_1d4 * local_1d8 * local_1e0;
  local_1c0 = in_RDI;
  for (local_1e8 = 0; local_1e8 < local_1dc; local_1e8 = local_1e8 + 1) {
    local_1a8 = &local_238;
    local_9c = *(int *)((long)local_1c0 + 0x2c);
    local_a0 = (int)local_1c0[6];
    local_a4 = *(undefined4 *)((long)local_1c0 + 0x34);
    x = (float *)(*local_1c0 + local_1c0[8] * (long)local_1e8 * local_1c0[2]);
    local_b8 = local_1c0[2];
    local_bc = (undefined4)local_1c0[3];
    local_c8 = local_1c0[4];
    local_98 = &local_238;
    local_88 = (long)local_9c * (long)local_a0 * local_b8;
    local_1a0 = &local_238;
    this = (unary_op_cos *)&local_238;
    local_8c = 0x10;
    local_1b4 = local_1e8;
    local_1b5 = 1;
    local_238 = 0;
    local_228 = 0;
    local_220 = 0;
    local_210 = 0;
    local_20c = 0;
    local_208 = 0;
    local_204 = 0;
    local_200 = 0;
    local_1f8 = 0;
    local_230 = 0;
    local_1f0 = x;
    local_190 = this;
    local_b0 = x;
    local_78 = this;
    local_218 = local_c8;
    for (local_23c = 0; local_23c + 0xf < local_1e4; local_23c = local_23c + 0x10) {
      local_188 = local_1f0;
      uVar6 = *(undefined8 *)local_1f0;
      uVar5 = *(undefined8 *)(local_1f0 + 2);
      uVar7 = *(undefined8 *)(local_1f0 + 4);
      uVar8 = *(undefined8 *)(local_1f0 + 6);
      uVar9 = *(undefined8 *)(local_1f0 + 8);
      uVar10 = *(undefined8 *)(local_1f0 + 10);
      uVar11 = *(undefined8 *)(local_1f0 + 0xc);
      uVar12 = *(undefined8 *)(local_1f0 + 0xe);
      local_280 = uVar6;
      uStack_278 = uVar5;
      uStack_270 = uVar7;
      uStack_268 = uVar8;
      uStack_260 = uVar9;
      uStack_258 = uVar10;
      uStack_250 = uVar11;
      uStack_248 = uVar12;
      UnaryOp_x86_avx512_functor::unary_op_cos::func_pack16(this,(__m512 *)x);
      local_130 = local_1f0;
      afVar1[2] = (float)(int)uVar5;
      afVar1[3] = (float)(int)((ulong)uVar5 >> 0x20);
      afVar1[0] = (float)(int)uVar6;
      afVar1[1] = (float)(int)((ulong)uVar6 >> 0x20);
      afVar1[4] = (float)(int)uVar7;
      afVar1[5] = (float)(int)((ulong)uVar7 >> 0x20);
      afVar1[6] = (float)(int)uVar8;
      afVar1[7] = (float)(int)((ulong)uVar8 >> 0x20);
      afVar1[8] = (float)(int)uVar9;
      afVar1[9] = (float)(int)((ulong)uVar9 >> 0x20);
      afVar1[10] = (float)(int)uVar10;
      afVar1[0xb] = (float)(int)((ulong)uVar10 >> 0x20);
      afVar1[0xc] = (float)(int)uVar11;
      afVar1[0xd] = (float)(int)((ulong)uVar11 >> 0x20);
      afVar1[0xe] = (float)(int)uVar12;
      afVar1[0xf] = (float)(int)((ulong)uVar12 >> 0x20);
      *(__m512 *)local_1f0 = afVar1;
      local_1f0 = local_1f0 + 0x10;
      local_280 = uVar6;
      uStack_278 = uVar5;
      uStack_270 = uVar7;
      uStack_268 = uVar8;
      uStack_260 = uVar9;
      uStack_258 = uVar10;
      uStack_250 = uVar11;
      uStack_248 = uVar12;
      local_180 = uVar6;
      uStack_178 = uVar5;
      uStack_170 = uVar7;
      uStack_168 = uVar8;
      uStack_160 = uVar9;
      uStack_158 = uVar10;
      uStack_150 = uVar11;
      uStack_148 = uVar12;
    }
    for (; local_23c + 7 < local_1e4; local_23c = local_23c + 8) {
      local_128 = local_1f0;
      uVar6 = *(undefined8 *)local_1f0;
      uVar5 = *(undefined8 *)(local_1f0 + 2);
      uVar7 = *(undefined8 *)(local_1f0 + 4);
      uVar8 = *(undefined8 *)(local_1f0 + 6);
      local_2a0 = uVar6;
      uStack_298 = uVar5;
      uStack_290 = uVar7;
      uStack_288 = uVar8;
      UnaryOp_x86_avx512_functor::unary_op_cos::func_pack8
                (in_stack_fffffffffffffd10,(__m256 *)in_stack_fffffffffffffd08);
      local_f0 = local_1f0;
      auVar2._8_8_ = uVar5;
      auVar2._0_8_ = uVar6;
      auVar2._16_8_ = uVar7;
      auVar2._24_8_ = uVar8;
      *(undefined1 (*) [32])local_1f0 = auVar2;
      local_1f0 = local_1f0 + 8;
      local_2a0 = uVar6;
      uStack_298 = uVar5;
      uStack_290 = uVar7;
      uStack_288 = uVar8;
      local_120 = uVar6;
      uStack_118 = uVar5;
      uStack_110 = uVar7;
      uStack_108 = uVar8;
    }
    for (; local_23c + 3 < local_1e4; local_23c = local_23c + 4) {
      local_e8 = local_1f0;
      local_2b0 = *(float (*) [2])local_1f0;
      uVar6 = *(undefined8 *)(local_1f0 + 2);
      afStack_2a8 = (float  [2])uVar6;
      afVar13 = UnaryOp_x86_avx512_functor::unary_op_cos::func_pack4(local_1c9,(__m128 *)local_2b0);
      local_2b0 = afVar13._0_8_;
      local_d0 = local_1f0;
      auVar3._8_4_ = (float)uVar6;
      auVar3._12_4_ = SUB84(uVar6,4);
      auVar3._0_4_ = local_2b0[0];
      auVar3._4_4_ = local_2b0[1];
      *(undefined1 (*) [16])local_1f0 = auVar3;
      local_1f0 = local_1f0 + 4;
      afStack_2a8 = (float  [2])uVar6;
      local_e0 = local_2b0;
      afStack_d8 = (float  [2])uVar6;
    }
    for (; local_23c < local_1e4; local_23c = local_23c + 1) {
      fVar4 = UnaryOp_x86_avx512_functor::unary_op_cos::func
                        (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      *local_1f0 = fVar4;
      local_1f0 = local_1f0 + 1;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}